

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O1

int run_test_poll_oob(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  uv_idle_t *loop;
  int *piVar4;
  ssize_t sVar5;
  uint extraout_EDX;
  char *unaff_RBX;
  uv_tcp_t *puVar6;
  uv_poll_t *puVar7;
  int *unaff_R14;
  sockaddr_in *unaff_R15;
  sockaddr_in *psVar8;
  sockaddr_in addr;
  undefined1 auStack_6c [20];
  int *piStack_58;
  undefined1 *puStack_50;
  sockaddr_in sStack_28;
  
  psVar8 = &sStack_28;
  puVar6 = (uv_tcp_t *)0x1b4e3a;
  iVar2 = 0x23a3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_28);
  if (iVar1 == 0) {
    unaff_RBX = (char *)uv_default_loop();
    iVar2 = 0x340cf0;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&server_handle);
    if (iVar1 != 0) goto LAB_00170c23;
    iVar2 = 0x340de8;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&client_handle);
    if (iVar1 != 0) goto LAB_00170c28;
    iVar2 = 0x340ee0;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&peer_handle);
    if (iVar1 != 0) goto LAB_00170c2d;
    iVar2 = 0x340fd8;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_idle_init((uv_loop_t *)unaff_RBX,&idle);
    if (iVar1 != 0) goto LAB_00170c32;
    puVar6 = &server_handle;
    iVar2 = (int)&sStack_28;
    iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)&sStack_28,0);
    if (iVar1 != 0) goto LAB_00170c37;
    puVar6 = &server_handle;
    iVar2 = 1;
    iVar1 = uv_listen((uv_stream_t *)&server_handle,1,connection_cb);
    if (iVar1 != 0) goto LAB_00170c3c;
    puVar6 = &client_handle;
    iVar2 = 1;
    iVar1 = uv_tcp_nodelay(&client_handle,1);
    if (iVar1 != 0) goto LAB_00170c41;
    puVar6 = (uv_tcp_t *)0x2;
    iVar2 = 1;
    client_fd = socket(2,1,0);
    if (client_fd < 0) goto LAB_00170c46;
    unaff_R14 = __errno_location();
    do {
      *unaff_R14 = 0;
      puVar6 = (uv_tcp_t *)(ulong)(uint)client_fd;
      iVar2 = (int)&sStack_28;
      iVar1 = connect(client_fd,(sockaddr *)&sStack_28,0x10);
      if (iVar1 != -1) break;
    } while (*unaff_R14 == 4);
    if (iVar1 != 0) {
      run_test_poll_oob_cold_16();
      unaff_R15 = &sStack_28;
      goto LAB_00170c1e;
    }
    iVar2 = 0;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00170c4b;
    psVar8 = &sStack_28;
    if (ticks != 10) goto LAB_00170c50;
    psVar8 = &sStack_28;
    if (cli_pr_check == '\0') goto LAB_00170c55;
    psVar8 = &sStack_28;
    if (cli_rd_check != 2) goto LAB_00170c5a;
    psVar8 = &sStack_28;
    if (srv_rd_check == '\0') goto LAB_00170c5f;
    unaff_RBX = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    iVar2 = 0;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    puVar6 = (uv_tcp_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)puVar6);
    psVar8 = &sStack_28;
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_00170c1e:
    run_test_poll_oob_cold_1();
LAB_00170c23:
    run_test_poll_oob_cold_2();
LAB_00170c28:
    run_test_poll_oob_cold_3();
LAB_00170c2d:
    run_test_poll_oob_cold_4();
LAB_00170c32:
    run_test_poll_oob_cold_5();
LAB_00170c37:
    run_test_poll_oob_cold_6();
LAB_00170c3c:
    run_test_poll_oob_cold_7();
LAB_00170c41:
    run_test_poll_oob_cold_8();
LAB_00170c46:
    psVar8 = unaff_R15;
    run_test_poll_oob_cold_9();
LAB_00170c4b:
    run_test_poll_oob_cold_10();
LAB_00170c50:
    run_test_poll_oob_cold_11();
LAB_00170c55:
    run_test_poll_oob_cold_12();
LAB_00170c5a:
    run_test_poll_oob_cold_13();
LAB_00170c5f:
    run_test_poll_oob_cold_14();
  }
  run_test_poll_oob_cold_15();
  if (iVar2 == 0) {
    iVar2 = uv_accept((uv_stream_t *)puVar6,(uv_stream_t *)&peer_handle);
    loop = (uv_idle_t *)puVar6;
    if (iVar2 != 0) goto LAB_00170db7;
    puVar6 = &peer_handle;
    iVar2 = uv_fileno((uv_handle_t *)&peer_handle,&server_fd);
    loop = (uv_idle_t *)puVar6;
    if (iVar2 != 0) goto LAB_00170dbc;
    loop = (uv_idle_t *)uv_default_loop();
    iVar2 = uv_poll_init_socket((uv_loop_t *)loop,poll_req,client_fd);
    if (iVar2 != 0) goto LAB_00170dc1;
    loop = (uv_idle_t *)uv_default_loop();
    iVar2 = uv_poll_init_socket((uv_loop_t *)loop,poll_req + 1,server_fd);
    if (iVar2 != 0) goto LAB_00170dc6;
    puVar7 = poll_req;
    iVar2 = uv_poll_start(poll_req,0xb,poll_cb);
    loop = (uv_idle_t *)puVar7;
    if (iVar2 != 0) goto LAB_00170dcb;
    loop = (uv_idle_t *)(poll_req + 1);
    iVar2 = uv_poll_start(poll_req + 1,1,poll_cb);
    if (iVar2 != 0) goto LAB_00170dd0;
    unaff_RBX = "hello";
    do {
      loop = (uv_idle_t *)(ulong)(uint)server_fd;
      unaff_R14 = (int *)send(server_fd,"hello",5,1);
      if (-1 < (int)unaff_R14) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((int)unaff_R14 != 5) goto LAB_00170dd5;
    unaff_RBX = "world";
    do {
      loop = (uv_idle_t *)(ulong)(uint)server_fd;
      unaff_R14 = (int *)send(server_fd,"world",5,0);
      if (-1 < (int)unaff_R14) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((int)unaff_R14 != 5) goto LAB_00170dda;
    loop = &idle;
    iVar2 = uv_idle_start(&idle,idle_cb);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    connection_cb_cold_1();
    loop = (uv_idle_t *)puVar6;
LAB_00170db7:
    connection_cb_cold_2();
LAB_00170dbc:
    connection_cb_cold_3();
LAB_00170dc1:
    connection_cb_cold_4();
LAB_00170dc6:
    connection_cb_cold_5();
LAB_00170dcb:
    connection_cb_cold_6();
LAB_00170dd0:
    connection_cb_cold_7();
LAB_00170dd5:
    connection_cb_cold_8();
LAB_00170dda:
    connection_cb_cold_9();
  }
  connection_cb_cold_10();
  auStack_6c._12_8_ = unaff_RBX;
  piStack_58 = unaff_R14;
  puStack_50 = (undefined1 *)psVar8;
  iVar2 = uv_fileno((uv_handle_t *)loop,(uv_os_fd_t *)(auStack_6c + 8));
  if (iVar2 == 0) {
    auStack_6c[4] = '\0';
    auStack_6c._0_4_ = 0;
    uVar3 = 0;
    if ((extraout_EDX & 8) != 0) {
      do {
        loop = (uv_idle_t *)(ulong)(uint)client_fd;
        sVar5 = recv(client_fd,auStack_6c,5,1);
        if ((int)sVar5 != -1) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      if ((-1 < (int)sVar5) || (piVar4 = __errno_location(), *piVar4 != 0x16)) {
        cli_pr_check = '\x01';
        puVar7 = poll_req;
        iVar2 = uv_poll_stop(poll_req);
        loop = (uv_idle_t *)puVar7;
        if (iVar2 != 0) goto LAB_00171093;
        puVar7 = poll_req;
        uVar3 = uv_poll_start(poll_req,3,poll_cb);
        loop = (uv_idle_t *)puVar7;
        if (uVar3 == 0) goto LAB_00170e92;
        goto LAB_00171098;
      }
      goto LAB_001710ac;
    }
LAB_00170e92:
    if ((extraout_EDX & 1) == 0) goto LAB_00171045;
    if (auStack_6c._8_4_ != client_fd) goto LAB_00170fc6;
    do {
      loop = (uv_idle_t *)(ulong)(uint)client_fd;
      sVar5 = recv(client_fd,auStack_6c,5,0);
      iVar2 = (int)sVar5;
      if (iVar2 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((iVar2 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) goto LAB_001710bb;
    if (cli_rd_check == 1) {
      loop = (uv_idle_t *)auStack_6c;
      iVar1 = strncmp((char *)loop,"world",(long)iVar2);
      if (iVar1 != 0) goto LAB_001710b1;
      if (iVar2 == 5) {
        cli_rd_check = 2;
        goto LAB_00170f24;
      }
      goto LAB_001710b6;
    }
LAB_00170f24:
    if (cli_rd_check == 0) {
      if (iVar2 != 4) goto LAB_001710c0;
      if (auStack_6c._0_4_ == 0x6c6c6568) {
        iVar2 = 1;
LAB_00170f5e:
        do {
          cli_rd_check = iVar2;
          loop = (uv_idle_t *)(ulong)(uint)server_fd;
          sVar5 = recv(server_fd,auStack_6c,5,0);
          iVar1 = (int)sVar5;
          if (iVar1 == -1) {
            piVar4 = __errno_location();
            iVar2 = cli_rd_check;
            if (*piVar4 == 4) goto LAB_00170f5e;
          }
          if (iVar1 < 1) goto LAB_00170fb1;
          if (iVar1 != 5) {
            poll_cb_cold_14();
            goto LAB_0017108e;
          }
          iVar2 = 2;
        } while (auStack_6c[4] == 'd' && auStack_6c._0_4_ == 0x6c726f77);
        poll_cb_cold_15();
LAB_00170fb1:
        piVar4 = __errno_location();
        if ((*piVar4 != 0xb) && (*piVar4 != 0x73)) goto LAB_001710cf;
        goto LAB_00170fc6;
      }
      goto LAB_001710c5;
    }
LAB_00170fc6:
    uVar3 = auStack_6c._8_4_;
    if (auStack_6c._8_4_ != server_fd) {
LAB_00171045:
      if ((extraout_EDX & 2) == 0) {
        return uVar3;
      }
      do {
        loop = (uv_idle_t *)(ulong)(uint)client_fd;
        piVar4 = (int *)send(client_fd,"foo",3,0);
        iVar2 = (int)piVar4;
        if (-1 < iVar2) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      if (iVar2 == 3) {
        return (int)piVar4;
      }
      goto LAB_0017109d;
    }
    do {
      loop = (uv_idle_t *)(ulong)(uint)server_fd;
      sVar5 = recv(server_fd,auStack_6c,3,0);
      iVar2 = (int)sVar5;
      if (iVar2 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((-1 < iVar2) || (piVar4 = __errno_location(), *piVar4 != 0x16)) {
      if (iVar2 != 3) goto LAB_001710a2;
      if (auStack_6c[2] == 'o' && (short)auStack_6c._0_4_ == 0x6f66) {
        srv_rd_check = '\x01';
        uVar3 = uv_poll_stop(poll_req + 1);
        goto LAB_00171045;
      }
      goto LAB_001710a7;
    }
  }
  else {
LAB_0017108e:
    poll_cb_cold_1();
LAB_00171093:
    poll_cb_cold_3();
LAB_00171098:
    poll_cb_cold_4();
LAB_0017109d:
    poll_cb_cold_16();
LAB_001710a2:
    poll_cb_cold_11();
LAB_001710a7:
    poll_cb_cold_12();
LAB_001710ac:
    poll_cb_cold_2();
LAB_001710b1:
    poll_cb_cold_6();
LAB_001710b6:
    poll_cb_cold_7();
LAB_001710bb:
    poll_cb_cold_5();
LAB_001710c0:
    poll_cb_cold_8();
LAB_001710c5:
    poll_cb_cold_9();
  }
  poll_cb_cold_10();
LAB_001710cf:
  poll_cb_cold_13();
  uv_sleep(100);
  iVar2 = ticks;
  ticks = ticks + 1;
  if (iVar2 < 9) {
    return iVar2;
  }
  uv_poll_stop(poll_req);
  uv_poll_stop(poll_req + 1);
  uv_close((uv_handle_t *)&server_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&client_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&peer_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(poll_oob) {
  struct sockaddr_in addr;
  int r = 0;
  uv_loop_t* loop;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_init(loop, &peer_handle));
  ASSERT(0 == uv_idle_init(loop, &idle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT(0 == uv_tcp_nodelay(&client_handle, 1));

  client_fd = socket(PF_INET, SOCK_STREAM, 0);
  ASSERT(client_fd >= 0);
  do {
    errno = 0;
    r = connect(client_fd, (const struct sockaddr*)&addr, sizeof(addr));
  } while (r == -1 && errno == EINTR);
  ASSERT(r == 0);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(ticks == kMaxTicks);

  /* Did client receive the POLLPRI message */
  ASSERT(cli_pr_check == 1);
  /* Did client receive the POLLIN message */
  ASSERT(cli_rd_check == 2);
  /* Could we write with POLLOUT and did the server receive our POLLOUT message
   * through POLLIN.
   */
  ASSERT(srv_rd_check == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}